

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_tile_header
                   (opj_j2k_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,OPJ_BOOL *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  uint tileno;
  uint uVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  opj_codestream_index_t *poVar5;
  opj_tcp_t *poVar6;
  opj_tp_index_t *poVar7;
  void *__src;
  opj_ppx *poVar8;
  opj_tcd_tile_t *poVar9;
  OPJ_BOOL OVar10;
  uint uVar11;
  OPJ_OFF_T OVar12;
  OPJ_SIZE_T OVar13;
  opj_dec_memory_marker_handler *poVar14;
  OPJ_BYTE *pOVar15;
  ulong uVar16;
  OPJ_SIZE_T OVar17;
  long lVar18;
  OPJ_BYTE **ppOVar19;
  long lVar20;
  char *pcVar21;
  OPJ_UINT32 OVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  OPJ_UINT32 l_current_marker;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 l_tot_len;
  OPJ_UINT32 l_marker_size_1;
  OPJ_OFF_T local_80;
  OPJ_UINT32 local_78;
  OPJ_UINT32 l_current_part;
  OPJ_UINT32 l_tile_no;
  OPJ_UINT32 l_current_marker_1;
  OPJ_UINT32 *local_68;
  OPJ_UINT32 *local_60;
  OPJ_INT32 *local_58;
  OPJ_INT32 *local_50;
  OPJ_INT32 *local_48;
  OPJ_BYTE l_header_data [10];
  
  l_current_marker = 0xff90;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb4,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb5,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_68 = p_tile_index;
  local_60 = p_data_size;
  local_58 = p_tile_x0;
  local_50 = p_tile_y0;
  local_48 = p_tile_x1;
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1eb6,
                  "OPJ_BOOL opj_j2k_read_tile_header(opj_j2k_t *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_BOOL *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar22 = (p_j2k->m_specific_param).m_decoder.m_state;
  if (OVar22 != 8) {
    if (OVar22 != 0x100) {
      return 0;
    }
    l_current_marker = 0xffd9;
  }
  while (((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0 &&
         (l_current_marker != 0xffd9))) {
    while (l_current_marker != 0xff93) {
      OVar12 = opj_stream_get_number_byte_left(p_stream);
      if (OVar12 == 0) {
LAB_0010c757:
        (p_j2k->m_specific_param).m_decoder.m_state = 0x40;
        break;
      }
      OVar13 = opj_stream_read_data
                         (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar13 != 2) goto LAB_0010caff;
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_marker_size,2);
      if (l_marker_size < 2) {
        pcVar21 = "Inconsistent marker size\n";
        goto LAB_0010ce4a;
      }
      if ((l_current_marker == 0x8080) &&
         (OVar12 = opj_stream_get_number_byte_left(p_stream), OVar12 == 0)) goto LAB_0010c757;
      uVar11 = (p_j2k->m_specific_param).m_decoder.m_state;
      if ((uVar11 & 0x10) != 0) {
        (p_j2k->m_specific_param).m_decoder.m_sot_length =
             ((p_j2k->m_specific_param).m_decoder.m_sot_length - l_marker_size) - 2;
      }
      OVar22 = l_marker_size - 2;
      l_marker_size = OVar22;
      poVar14 = opj_j2k_get_marker_handler(l_current_marker);
      if ((poVar14->states & uVar11) == 0) {
        pcVar21 = "Marker is not compliant with its position\n";
        goto LAB_0010ce4a;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < OVar22) {
        OVar12 = opj_stream_get_number_byte_left(p_stream);
        if (OVar12 < (long)(ulong)OVar22) {
          pcVar21 = "Marker size inconsistent with stream length\n";
          goto LAB_0010ce4a;
        }
        pOVar15 = (OPJ_BYTE *)
                  opj_realloc((p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)l_marker_size
                             );
        if (pOVar15 == (OPJ_BYTE *)0x0) {
          opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
          (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
          (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
          pcVar21 = "Not enough memory to read header\n";
          goto LAB_0010ce4a;
        }
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar15;
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = l_marker_size;
        OVar22 = l_marker_size;
      }
      else {
        pOVar15 = (p_j2k->m_specific_param).m_decoder.m_header_data;
      }
      OVar13 = opj_stream_read_data(p_stream,pOVar15,(ulong)OVar22,p_manager);
      if (OVar13 != l_marker_size) goto LAB_0010caff;
      if (poVar14->handler ==
          (_func_OPJ_BOOL_opj_j2k_t_ptr_OPJ_BYTE_ptr_OPJ_UINT32_opj_event_mgr_t_ptr *)0x0) {
        pcVar21 = "Not sure how that happened.\n";
        goto LAB_0010ce4a;
      }
      OVar10 = (*poVar14->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,
                                   l_marker_size,p_manager);
      if (OVar10 == 0) {
        opj_event_msg(p_manager,1,"Fail to read the current marker segment (%#x)\n",
                      (ulong)l_current_marker);
        return 0;
      }
      local_80 = CONCAT44(local_80._4_4_,p_j2k->m_current_tile_number);
      poVar5 = p_j2k->cstr_index;
      OVar22 = poVar14->id;
      OVar12 = opj_stream_tell(p_stream);
      OVar10 = opj_j2k_add_tlmarker
                         ((OPJ_UINT32)local_80,poVar5,OVar22,
                          (ulong)(((int)OVar12 - l_marker_size) - 4),l_marker_size + 4);
      if (OVar10 == 0) {
        pcVar21 = "Not enough memory to add tl marker\n";
        goto LAB_0010ce4a;
      }
      if (poVar14->id == 0xff90) {
        OVar12 = opj_stream_tell(p_stream);
        uVar16 = (ulong)(((int)OVar12 - l_marker_size) - 4);
        if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar16) {
          (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar16;
        }
      }
      if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 4) == 0) {
        OVar13 = opj_stream_read_data
                           (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
        if (OVar13 != 2) goto LAB_0010caff;
        opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
      }
      else {
        uVar16 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length,
                                 p_manager);
        if (uVar16 != (p_j2k->m_specific_param).m_decoder.m_sot_length) goto LAB_0010caff;
        l_current_marker = 0xff93;
      }
    }
    OVar12 = opj_stream_get_number_byte_left(p_stream);
    if ((OVar12 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) break;
    bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
    if ((bVar1 & 4) != 0) {
      *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 & 0xfa;
      (p_j2k->m_specific_param).m_decoder.m_state = 8;
      goto LAB_0010cacd;
    }
    uVar11 = p_j2k->m_current_tile_number;
    poVar6 = (p_j2k->m_cp).tcps;
    if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
      uVar24 = (p_j2k->m_specific_param).m_decoder.m_sot_length;
      if (1 < uVar24) goto LAB_0010c7c5;
    }
    else {
      OVar12 = opj_stream_get_number_byte_left(p_stream);
      uVar24 = (uint)OVar12;
LAB_0010c7c5:
      uVar24 = uVar24 - 2;
      (p_j2k->m_specific_param).m_decoder.m_sot_length = uVar24;
    }
    if (uVar24 != 0) {
      OVar12 = opj_stream_get_number_byte_left(p_stream);
      if (OVar12 < (long)(ulong)uVar24) {
        opj_event_msg(p_manager,2,"Tile part length size inconsistent with stream length\n");
      }
      if (poVar6[uVar11].m_data == (OPJ_BYTE *)0x0) {
        pOVar15 = (OPJ_BYTE *)opj_malloc((ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length);
        poVar6[uVar11].m_data = pOVar15;
        if (pOVar15 == (OPJ_BYTE *)0x0) goto LAB_0010ce8c;
      }
      else {
        pOVar15 = (OPJ_BYTE *)
                  opj_realloc(poVar6[uVar11].m_data,
                              (ulong)((p_j2k->m_specific_param).m_decoder.m_sot_length +
                                     poVar6[uVar11].m_data_size));
        if (pOVar15 == (OPJ_BYTE *)0x0) {
          opj_free(poVar6[uVar11].m_data);
          poVar6[uVar11].m_data = (OPJ_BYTE *)0x0;
LAB_0010ce8c:
          pcVar21 = "Not enough memory to decode tile\n";
          goto LAB_0010ce4a;
        }
        poVar6[uVar11].m_data = pOVar15;
      }
    }
    poVar5 = p_j2k->cstr_index;
    if (poVar5 != (opj_codestream_index_t *)0x0) {
      OVar12 = opj_stream_tell(p_stream);
      tileno = p_j2k->m_current_tile_number;
      uVar2 = poVar5->tile_index[tileno].current_tpsno;
      poVar7 = poVar5->tile_index[tileno].tp_index;
      poVar7[uVar2].end_header = OVar12 + -2;
      poVar7[uVar2].end_pos = (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar12;
      OVar10 = opj_j2k_add_tlmarker
                         (tileno,poVar5,0xff93,OVar12 + -2,
                          (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
      if (OVar10 == 0) {
        pcVar21 = "Not enough memory to add tl marker\n";
        goto LAB_0010ce4a;
      }
    }
    OVar13 = (OPJ_SIZE_T)(p_j2k->m_specific_param).m_decoder.m_sot_length;
    if (uVar24 == 0) {
      OVar17 = 0;
    }
    else {
      OVar17 = opj_stream_read_data
                         (p_stream,poVar6[uVar11].m_data + poVar6[uVar11].m_data_size,OVar13,
                          p_manager);
      OVar13 = (OPJ_SIZE_T)(p_j2k->m_specific_param).m_decoder.m_sot_length;
    }
    OVar22 = 0x40;
    if (OVar17 == OVar13) {
      OVar22 = 8;
    }
    (p_j2k->m_specific_param).m_decoder.m_state = OVar22;
    poVar6[uVar11].m_data_size = poVar6[uVar11].m_data_size + (int)OVar17;
    bVar1 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
    if ((bVar1 & 9) == 1) {
      *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar1 | 8;
      OVar22 = p_j2k->m_current_tile_number;
      OVar10 = opj_stream_has_seek(p_stream);
      if ((OVar10 != 0) && (OVar12 = opj_stream_tell(p_stream), OVar12 != -1)) {
        do {
          local_80 = OVar12;
          OVar13 = opj_stream_read_data(p_stream,l_header_data,2,p_manager);
          bVar26 = true;
          if ((OVar13 != 2) ||
             (opj_read_bytes_LE(l_header_data,&l_current_marker_1,2), l_current_marker_1 != 0xff90))
          break;
          OVar13 = opj_stream_read_data(p_stream,l_header_data,2,p_manager);
          if (OVar13 != 2) {
LAB_0010cb85:
            pcVar21 = "Stream too short\n";
LAB_0010ce2e:
            opj_event_msg(p_manager,1,pcVar21);
            goto LAB_0010ce3b;
          }
          opj_read_bytes_LE(l_header_data,&l_marker_size_1,2);
          if (l_marker_size_1 != 10) {
            pcVar21 = "Inconsistent marker size\n";
            goto LAB_0010ce2e;
          }
          l_marker_size_1 = 8;
          OVar13 = opj_stream_read_data(p_stream,l_header_data,8,p_manager);
          if (OVar13 != l_marker_size_1) goto LAB_0010cb85;
          OVar10 = opj_j2k_get_sot_values
                             (l_header_data,l_marker_size_1,&l_tile_no,&l_tot_len,&l_current_part,
                              &local_78,p_manager);
          if (OVar10 == 0) goto LAB_0010ce3b;
          if (l_tile_no == OVar22) {
            bVar26 = l_current_part != local_78;
            break;
          }
          if (l_tot_len < 0xe) break;
          l_tot_len = l_tot_len - 0xc;
          uVar16 = opj_stream_skip(p_stream,(ulong)l_tot_len,p_manager);
          OVar12 = local_80;
        } while (uVar16 == l_tot_len);
        OVar10 = opj_stream_seek(p_stream,local_80,p_manager);
        if (OVar10 != 0) {
          if (!bVar26) {
            OVar22 = (p_j2k->m_cp).th;
            OVar3 = (p_j2k->m_cp).tw;
            *(byte *)((long)&p_j2k->m_specific_param + 0x54) =
                 *(byte *)((long)&p_j2k->m_specific_param + 0x54) & 0xee | 0x10;
            for (lVar18 = 0; (ulong)(OVar22 * OVar3) * 0x1640 - lVar18 != 0;
                lVar18 = lVar18 + 0x1640) {
              poVar6 = (p_j2k->m_cp).tcps;
              iVar4 = *(int *)((long)&poVar6->m_nb_tile_parts + lVar18);
              if (iVar4 != 0) {
                *(int *)((long)&poVar6->m_nb_tile_parts + lVar18) = iVar4 + 1;
              }
            }
            opj_event_msg(p_manager,2,"Non conformant codestream TPsot==TNsot.\n");
          }
          goto LAB_0010cac6;
        }
LAB_0010ce3b:
        pcVar21 = "opj_j2k_apply_nb_tile_parts_correction error\n";
        goto LAB_0010ce4a;
      }
    }
LAB_0010cac6:
    if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
LAB_0010cacd:
      OVar13 = opj_stream_read_data
                         (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar13 != 2) {
LAB_0010caff:
        pcVar21 = "Stream too short\n";
        goto LAB_0010ce4a;
      }
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
    }
  }
  lVar18 = 8;
  if ((l_current_marker == 0xffd9) && ((p_j2k->m_specific_param).m_decoder.m_state != 0x100)) {
    p_j2k->m_current_tile_number = 0;
    (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
  }
  poVar6 = (p_j2k->m_cp).tcps;
  uVar16 = (ulong)p_j2k->m_current_tile_number;
  if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) {
    uVar11 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    for (ppOVar19 = &poVar6[uVar16].m_data;
        (uVar24 = (uint)uVar16, uVar24 < uVar11 && (*ppOVar19 == (OPJ_BYTE *)0x0));
        ppOVar19 = ppOVar19 + 0x2c8) {
      uVar16 = (ulong)(uVar24 + 1);
      p_j2k->m_current_tile_number = uVar24 + 1;
    }
    if (uVar11 != uVar24) goto LAB_0010cc1e;
    *p_go_on = 0;
LAB_0010cdf3:
    OVar10 = 1;
  }
  else {
LAB_0010cc1e:
    OVar22 = (OPJ_UINT32)uVar16;
    if (poVar6 == (opj_tcp_t *)0x0) {
      __assert_fail("p_tcp != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xf1e,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
    }
    if (poVar6[uVar16].ppt_buffer != (OPJ_BYTE *)0x0) {
      __assert_fail("p_tcp->ppt_buffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xf20,"OPJ_BOOL opj_j2k_merge_ppt(opj_tcp_t *, opj_event_mgr_t *)");
    }
    if ((poVar6[uVar16].field_0x1638 & 2) == 0) {
LAB_0010cd37:
      OVar10 = opj_tcd_init_decode_tile(p_j2k->m_tcd,OVar22,p_manager);
      if (OVar10 != 0) {
        opj_event_msg(p_manager,4,"Header of tile %d / %d has been read.\n",
                      (ulong)(p_j2k->m_current_tile_number + 1),
                      (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
        *local_68 = p_j2k->m_current_tile_number;
        *p_go_on = 1;
        OVar22 = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
        *local_60 = OVar22;
        poVar9 = p_j2k->m_tcd->tcd_image->tiles;
        *local_58 = poVar9->x0;
        *local_50 = poVar9->y0;
        *local_48 = poVar9->x1;
        *p_tile_y1 = poVar9->y1;
        *p_nb_comps = poVar9->numcomps;
        *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
        goto LAB_0010cdf3;
      }
      pcVar21 = "Cannot decode tile, memory error\n";
    }
    else {
      uVar11 = 0;
      for (lVar20 = 0; (ulong)poVar6[uVar16].ppt_markers_count << 4 != lVar20;
          lVar20 = lVar20 + 0x10) {
        uVar11 = uVar11 + *(int *)((long)&(poVar6[uVar16].ppt_markers)->m_data_size + lVar20);
      }
      pOVar15 = (OPJ_BYTE *)opj_malloc((ulong)uVar11);
      poVar6[uVar16].ppt_buffer = pOVar15;
      if (pOVar15 != (OPJ_BYTE *)0x0) {
        poVar6[uVar16].ppt_len = uVar11;
        uVar23 = 0;
        for (uVar25 = 0; uVar25 < poVar6[uVar16].ppt_markers_count; uVar25 = uVar25 + 1) {
          __src = *(void **)((long)poVar6[uVar16].ppt_markers + lVar18 + -8);
          if (__src != (void *)0x0) {
            memcpy(poVar6[uVar16].ppt_buffer + uVar23,__src,
                   (ulong)*(uint *)((long)&(poVar6[uVar16].ppt_markers)->m_data + lVar18));
            uVar23 = (ulong)(uint)((int)uVar23 +
                                  *(int *)((long)&(poVar6[uVar16].ppt_markers)->m_data + lVar18));
            opj_free(*(void **)((long)poVar6[uVar16].ppt_markers + lVar18 + -8));
            poVar8 = poVar6[uVar16].ppt_markers;
            *(undefined8 *)((long)poVar8 + lVar18 + -8) = 0;
            *(undefined4 *)((long)&poVar8->m_data + lVar18) = 0;
          }
          lVar18 = lVar18 + 0x10;
        }
        poVar6[uVar16].ppt_markers_count = 0;
        opj_free(poVar6[uVar16].ppt_markers);
        poVar6[uVar16].ppt_markers = (opj_ppx *)0x0;
        poVar6[uVar16].ppt_data = poVar6[uVar16].ppt_buffer;
        poVar6[uVar16].ppt_data_size = poVar6[uVar16].ppt_len;
        OVar22 = p_j2k->m_current_tile_number;
        goto LAB_0010cd37;
      }
      opj_event_msg(p_manager,1,"Not enough memory to read PPT marker\n");
      pcVar21 = "Failed to merge PPT data\n";
    }
LAB_0010ce4a:
    OVar10 = 0;
    opj_event_msg(p_manager,1,pcVar21);
  }
  return OVar10;
}

Assistant:

OPJ_BOOL opj_j2k_read_tile_header(      opj_j2k_t * p_j2k,
                                                                    OPJ_UINT32 * p_tile_index,
                                                                    OPJ_UINT32 * p_data_size,
                                                                    OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
                                                                    OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
                                                                    OPJ_UINT32 * p_nb_comps,
                                                                    OPJ_BOOL * p_go_on,
                                                                    opj_stream_private_t *p_stream,
                                                                    opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 l_current_marker = J2K_MS_SOT;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        opj_tcp_t * l_tcp = NULL;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /* Reach the End Of Codestream ?*/
        if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
                l_current_marker = J2K_MS_EOC;
        }
        /* We need to encounter a SOT marker (a new tile-part header) */
        else if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
                return OPJ_FALSE;
        }

        /* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
        while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

                /* Try to read until the Start Of Data is detected */
                while (l_current_marker != J2K_MS_SOD) {
                    
                    if(opj_stream_get_number_byte_left(p_stream) == 0)
                    {
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                        break;
                    }

                        /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from the buffer as the marker size */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

                        /* Check marker size (does not include marker ID but includes marker size) */
                        if (l_marker_size < 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Inconsistent marker size\n");
                                return OPJ_FALSE;
                        }

                        /* cf. https://code.google.com/p/openjpeg/issues/detail?id=226 */
                        if (l_current_marker == 0x8080 && opj_stream_get_number_byte_left(p_stream) == 0) {
                                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                                break;
                        }

                        /* Why this condition? FIXME */
                        if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
                                p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
                        }
                        l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                        /* Get the marker handler from the marker ID */
                        l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                        /* Check if the marker is known and if it is the right place to find it */
                        if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                                opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                                return OPJ_FALSE;
                        }
/* FIXME manage case of unknown marker as in the main header ? */

                        /* Check if the marker size is compatible with the header data size */
                        if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                                OPJ_BYTE *new_header_data = NULL;
                                /* If we are here, this means we consider this marker as known & we will read it */
                                /* Check enough bytes left in stream before allocation */
                                if ((OPJ_OFF_T)l_marker_size >  opj_stream_get_number_byte_left(p_stream)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Marker size inconsistent with stream length\n");
                                        return OPJ_FALSE;
                                }
                                new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                                if (! new_header_data) {
                                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                        p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                        return OPJ_FALSE;
                                }
                                p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                        }

                        /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        if (!l_marker_handler->handler) {
                                /* See issue #175 */
                                opj_event_msg(p_manager, EVT_ERROR, "Not sure how that happened.\n");
                                return OPJ_FALSE;
                        }
                        /* Read the marker segment with the correct marker handler */
                        if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                                opj_event_msg(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
                                return OPJ_FALSE;
                        }

                        /* Add the marker to the codestream index*/
                        if (OPJ_FALSE == opj_j2k_add_tlmarker(p_j2k->m_current_tile_number,
                                                p_j2k->cstr_index,
                                                l_marker_handler->id,
                                                (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                                l_marker_size + 4 )) {
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add tl marker\n");
                                return OPJ_FALSE;
                        }

                        /* Keep the position of the last SOT marker read */
                        if ( l_marker_handler->id == J2K_MS_SOT ) {
                                OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
                                if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
                                {
                                        p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
                                }
                        }

                        if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
                                /* Skip the rest of the tile part header*/
                                if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
                        }
                        else {
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }
                                /* Read 2 bytes from the buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                if(opj_stream_get_number_byte_left(p_stream) == 0
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;

                /* If we didn't skip data before, we need to read the SOD marker*/
                if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
                        /* Try to read the SOD marker and skip data ? FIXME */
                        if (! opj_j2k_read_sod(p_j2k, p_stream, p_manager)) {
                                return OPJ_FALSE;
                        }
                        if (p_j2k->m_specific_param.m_decoder.m_can_decode && !p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked) {
                                /* Issue 254 */
                                OPJ_BOOL l_correction_needed;
													
                                p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked = 1;
                                if(!opj_j2k_need_nb_tile_parts_correction(p_stream, p_j2k->m_current_tile_number, &l_correction_needed, p_manager)) {
                                        opj_event_msg(p_manager, EVT_ERROR, "opj_j2k_apply_nb_tile_parts_correction error\n");
                                        return OPJ_FALSE;
                                }
                                if (l_correction_needed) {
                                        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
                                        OPJ_UINT32 l_tile_no;

                                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                                        p_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction = 1;
                                        /* correct tiles */
                                        for (l_tile_no = 0U; l_tile_no < l_nb_tiles; ++l_tile_no) {
                                                if (p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts != 0U) {
                                                        p_j2k->m_cp.tcps[l_tile_no].m_nb_tile_parts+=1;
                                                }
                                        }
                                        opj_event_msg(p_manager, EVT_WARNING, "Non conformant codestream TPsot==TNsot.\n");
                                }
                        }
                        if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
                                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                        return OPJ_FALSE;
                                }

                                /* Read 2 bytes from buffer as the new marker ID */
                                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                        }
                }
                else {
                        /* Indicate we will try to read a new tile-part header*/
                        p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
                        p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

                        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                                return OPJ_FALSE;
                        }

                        /* Read 2 bytes from buffer as the new marker ID */
                        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
                }
        }

        /* Current marker is the EOC marker ?*/
        if (l_current_marker == J2K_MS_EOC) {
                if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
                        p_j2k->m_current_tile_number = 0;
                        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
                }
        }

        /* FIXME DOC ???*/
        if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
                OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
                l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;

                while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
                        ++p_j2k->m_current_tile_number;
                        ++l_tcp;
                }

                if (p_j2k->m_current_tile_number == l_nb_tiles) {
                        *p_go_on = OPJ_FALSE;
                        return OPJ_TRUE;
                }
        }

        if (! opj_j2k_merge_ppt(p_j2k->m_cp.tcps + p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPT data\n");
                return OPJ_FALSE;
        }
        /*FIXME ???*/
        if (! opj_tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number, p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
                return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
                        p_j2k->m_current_tile_number+1, (p_j2k->m_cp.th * p_j2k->m_cp.tw));

        *p_tile_index = p_j2k->m_current_tile_number;
        *p_go_on = OPJ_TRUE;
        *p_data_size = opj_tcd_get_decoded_tile_size(p_j2k->m_tcd);
        *p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
        *p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
        *p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
        *p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
        *p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

         p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

        return OPJ_TRUE;
}